

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O1

bool __thiscall IntBounds::SetIsNot(IntBounds *this,Value *value,bool isExplicit)

{
  ValueType *this_00;
  ValueInfo *this_01;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined7 in_register_00000011;
  bool bVar6;
  bool bVar7;
  int local_54;
  ValueRelativeOffset *pVStack_50;
  int i_1;
  ValueRelativeOffset *existingLowerBound;
  int constantValue;
  ValueNumber valueNumber;
  ValueRelativeOffset *existingUpperBound;
  
  existingUpperBound._4_4_ = (undefined4)CONCAT71(in_register_00000011,isExplicit);
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x108,"(value)","value");
    if (!bVar2) goto LAB_00567602;
    *puVar5 = 0;
  }
  this_01 = value->valueInfo;
  this_00 = &this_01->super_ValueType;
  bVar2 = ValueType::IsLikelyInt(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x10b,"(valueInfo->IsLikelyInt())","valueInfo->IsLikelyInt()");
    if (!bVar2) {
LAB_00567602:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = ValueInfo::TryGetIntConstantValue(this_01,(int32 *)&existingLowerBound,true);
  if (bVar2) {
    bVar2 = SetIsNot(this,(int)existingLowerBound,(bool)existingUpperBound._4_1_);
    bVar3 = ValueType::IsInt(this_00);
    if (bVar3) {
      return bVar2;
    }
  }
  else {
    bVar2 = false;
  }
  existingLowerBound._4_4_ = value->valueNumber;
  pVStack_50 = (ValueRelativeOffset *)0x0;
  bVar3 = JsUtil::
          BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    (&(this->relativeLowerBounds).
                      super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ,(uint *)((long)&existingLowerBound + 4),&stack0xffffffffffffffb0,
                     &constantValue);
  bVar7 = false;
  bVar6 = false;
  if (bVar3) {
    iVar4 = ValueRelativeOffset::Offset(pVStack_50);
    bVar6 = iVar4 == 0;
  }
  _constantValue = (ValueRelativeOffset *)0x0;
  bVar3 = JsUtil::
          BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    (&(this->relativeUpperBounds).
                      super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ,(uint *)((long)&existingLowerBound + 4),(ValueRelativeOffset **)&constantValue
                     ,&local_54);
  if (bVar3) {
    iVar4 = ValueRelativeOffset::Offset(_constantValue);
    bVar7 = iVar4 == 0;
  }
  if (bVar7 != bVar6) {
    if (bVar6 == false) {
      ValueRelativeOffset::SetOffset(_constantValue,-1);
      bVar2 = true;
      if (existingUpperBound._4_1_ != '\0') {
        ValueRelativeOffset::SetWasEstablishedExplicitly(_constantValue);
      }
    }
    else {
      ValueRelativeOffset::SetOffset(pVStack_50,1);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool IntBounds::SetIsNot(const Value *const value, const bool isExplicit)
{
    Assert(value);

    ValueInfo const *const valueInfo = value->GetValueInfo();
    Assert(valueInfo->IsLikelyInt());

    int constantValue;
    bool changed;
    if(valueInfo->TryGetIntConstantValue(&constantValue, true))
    {
        changed = SetIsNot(constantValue, isExplicit);
        if(valueInfo->IsInt())
            return changed;
    }
    else
        changed = false;

    const ValueNumber valueNumber = value->GetValueNumber();
    ValueRelativeOffset *existingLowerBound = nullptr;
    const bool existingLowerBoundOffsetIsZero =
        relativeLowerBounds.TryGetReference(valueNumber, &existingLowerBound) && existingLowerBound->Offset() == 0;
    ValueRelativeOffset *existingUpperBound = nullptr;
    const bool existingUpperBoundOffsetIsZero =
        relativeUpperBounds.TryGetReference(valueNumber, &existingUpperBound) && existingUpperBound->Offset() == 0;
    if(existingLowerBoundOffsetIsZero == existingUpperBoundOffsetIsZero)
        return changed; // neither bound can be changed, or changing a bound would contradict the opposite bound
    if(existingLowerBoundOffsetIsZero)
        existingLowerBound->SetOffset(1);
    else
    {
        existingUpperBound->SetOffset(-1);
        if(isExplicit)
            existingUpperBound->SetWasEstablishedExplicitly();
    }
    return true;
}